

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timing.h
# Opt level: O2

uint64_t nanotimer(void)

{
  int iVar1;
  timespec t;
  
  if (nanotimer_ever == '\0') {
    iVar1 = clock_gettime(1,(timespec *)&t);
    if (iVar1 != 0) {
      return 0;
    }
    nanotimer_ever = '\x01';
  }
  clock_gettime(1,(timespec *)&t);
  return t.tv_sec * 1000000000 + t.tv_nsec;
}

Assistant:

static
uint64_t nanotimer() {
    static int ever = 0;
#if defined(__APPLE__)
    static mach_timebase_info_data_t frequency;
    if (!ever) {
        if (mach_timebase_info(&frequency) != KERN_SUCCESS) {
            return 0;
        }
        ever = 1;
    }
    return  (mach_absolute_time() * frequency.numer / frequency.denom);
#elif defined(_WIN32)
    static LARGE_INTEGER frequency;
    if (!ever) {
        QueryPerformanceFrequency(&frequency);
        ever = 1;
    }
    LARGE_INTEGER t;
    QueryPerformanceCounter(&t);
    return (t.QuadPart * (uint64_t) 1e9) / frequency.QuadPart;
#else // __linux
    struct timespec t;
    if (!ever) {
        if (clock_gettime(CLOCK_MONOTONIC, &t) != 0) {
            return 0;
        }
        ever = 1;
    }
    clock_gettime(CLOCK_MONOTONIC, &t);
    return (t.tv_sec * (uint64_t) 1e9) + t.tv_nsec;
#endif
}